

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O0

void highbd_blend_a64_d16_mask_subw0_subh0_w16_sse4_1
               (uint16_t *dst,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int h,
               int w,__m128i *round_offset,int shift,__m128i *clip_low,__m128i *clip_high,
               __m128i *mask_max)

{
  undefined1 auVar1 [16];
  undefined8 extraout_XMM0_Qa;
  ulong extraout_XMM0_Qb;
  undefined1 auVar2 [16];
  long in_stack_00000008;
  uint in_stack_00000010;
  int in_stack_00000018;
  __m128i mask0h;
  __m128i mask0l;
  __m128i masks_u8;
  int j;
  int i;
  __m128i *in_stack_00000160;
  int in_stack_0000016c;
  __m128i *in_stack_00000170;
  CONV_BUF_TYPE *in_stack_00000178;
  CONV_BUF_TYPE *in_stack_00000180;
  uint16_t *in_stack_00000188;
  __m128i *in_stack_00000620;
  __m128i *in_stack_00000628;
  __m128i *in_stack_00000630;
  __m128i *in_stack_00000638;
  undefined4 local_5c;
  undefined4 local_58;
  
  for (local_58 = 0; local_58 < in_stack_00000018; local_58 = local_58 + 1) {
    for (local_5c = 0; local_5c < (int)mask0h[0]; local_5c = local_5c + 0x10) {
      xx_loadu_128((void *)(in_stack_00000008 + local_5c));
      auVar1._8_8_ = extraout_XMM0_Qb;
      auVar1._0_8_ = extraout_XMM0_Qa;
      pmovzxbw(auVar1,extraout_XMM0_Qa);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = extraout_XMM0_Qb;
      pmovzxbw(auVar2,extraout_XMM0_Qb);
      highbd_blend_a64_d16_mask_w16_sse4_1
                (in_stack_00000188,in_stack_00000180,in_stack_00000178,in_stack_00000170,
                 in_stack_0000016c,in_stack_00000160,in_stack_00000620,in_stack_00000628,
                 in_stack_00000630,in_stack_00000638);
    }
    in_stack_00000008 = in_stack_00000008 + (ulong)in_stack_00000010;
  }
  return;
}

Assistant:

static inline void highbd_blend_a64_d16_mask_subw0_subh0_w16_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int h, int w,
    const __m128i *round_offset, int shift, const __m128i *clip_low,
    const __m128i *clip_high, const __m128i *mask_max) {
  for (int i = 0; i < h; i++) {
    for (int j = 0; j < w; j += 16) {
      // Load 16x u8 alpha-mask values and pad to u16
      const __m128i masks_u8 = xx_loadu_128(mask + j);
      const __m128i mask0l = _mm_cvtepu8_epi16(masks_u8);
      const __m128i mask0h = _mm_cvtepu8_epi16(_mm_srli_si128(masks_u8, 8));

      highbd_blend_a64_d16_mask_w16_sse4_1(
          dst + j, src0 + j, src1 + j, round_offset, shift, &mask0l, &mask0h,
          clip_low, clip_high, mask_max);
    }
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += mask_stride;
  }
}